

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

bool __thiscall cmStateSnapshot::RaiseScope(cmStateSnapshot *this,string *var,char *varDef)

{
  PositionType *this_00;
  iterator other;
  StackIter begin;
  StackIter end;
  bool bVar1;
  PointerType pSVar2;
  PointerType pSVar3;
  size_t sVar4;
  PointerType this_01;
  string_view value;
  string_view value_00;
  cmStateSnapshot parentDir;
  cmStateSnapshot cStack_48;
  
  this_00 = &this->Position;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  other.Tree = (pSVar3->DirectoryParent).Tree;
  other.Position = (pSVar3->DirectoryParent).Position;
  bVar1 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator==
                    (&pSVar2->ScopeParent,other);
  if (bVar1) {
    GetBuildsystemDirectoryParent(&cStack_48,this);
    bVar1 = IsValid(&cStack_48);
    if (bVar1) {
      if (varDef == (char *)0x0) {
        RemoveDefinition(&cStack_48,var);
      }
      else {
        sVar4 = strlen(varDef);
        value._M_str = varDef;
        value._M_len = sVar4;
        SetDefinition(&cStack_48,var,value);
      }
    }
  }
  else {
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    begin.Tree = (pSVar2->Vars).Tree;
    begin.Position = (pSVar2->Vars).Position;
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    end.Tree = (pSVar2->Root).Tree;
    end.Position = (pSVar2->Root).Position;
    cmDefinitions::Raise(var,begin,end);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    this_01 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar2->Parent);
    if (varDef == (char *)0x0) {
      cmDefinitions::Unset(this_01,var);
    }
    else {
      sVar4 = strlen(varDef);
      value_00._M_str = varDef;
      value_00._M_len = sVar4;
      cmDefinitions::Set(this_01,var,value_00);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool cmStateSnapshot::RaiseScope(std::string const& var, const char* varDef)
{
  if (this->Position->ScopeParent == this->Position->DirectoryParent) {
    cmStateSnapshot parentDir = this->GetBuildsystemDirectoryParent();
    if (!parentDir.IsValid()) {
      return false;
    }
    // Update the definition in the parent directory top scope.  This
    // directory's scope was initialized by the closure of the parent
    // scope, so we do not need to localize the definition first.
    if (varDef) {
      parentDir.SetDefinition(var, varDef);
    } else {
      parentDir.RemoveDefinition(var);
    }
    return true;
  }
  // First localize the definition in the current scope.
  cmDefinitions::Raise(var, this->Position->Vars, this->Position->Root);

  // Now update the definition in the parent scope.
  if (varDef) {
    this->Position->Parent->Set(var, varDef);
  } else {
    this->Position->Parent->Unset(var);
  }
  return true;
}